

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_blend.cpp
# Opt level: O1

void V_AddBlend(float r,float g,float b,float a,float *v_blend)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (0.0 < a) {
    fVar2 = v_blend[3];
    fVar1 = (1.0 - fVar2) * a + fVar2;
    fVar2 = fVar2 / fVar1;
    fVar3 = 1.0 - fVar2;
    *v_blend = r * fVar3 + *v_blend * fVar2;
    v_blend[1] = g * fVar3 + v_blend[1] * fVar2;
    v_blend[2] = fVar3 * b + fVar2 * v_blend[2];
    v_blend[3] = fVar1;
  }
  return;
}

Assistant:

void V_AddBlend (float r, float g, float b, float a, float v_blend[4])
{
	float a2, a3;

	if (a <= 0)
		return;
	a2 = v_blend[3] + (1-v_blend[3])*a;	// new total alpha
	a3 = v_blend[3]/a2;		// fraction of color from old

	v_blend[0] = v_blend[0]*a3 + r*(1-a3);
	v_blend[1] = v_blend[1]*a3 + g*(1-a3);
	v_blend[2] = v_blend[2]*a3 + b*(1-a3);
	v_blend[3] = a2;
}